

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O0

void __thiscall
duckdb::DbpEncoder::WriteValue<duckdb::ParquetIntervalTargetType>
          (DbpEncoder *this,WriteStream *writer,ParquetIntervalTargetType *value)

{
  InternalException *this_00;
  allocator local_39;
  string local_38 [56];
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"DbpEncoder should only be used with integers",&local_39);
  duckdb::InternalException::InternalException(this_00,local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

void WriteValue(WriteStream &writer, const T &value) {
		throw InternalException("DbpEncoder should only be used with integers");
	}